

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_16x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int8_t *piVar20;
  int iVar21;
  ulong *puVar22;
  int32_t *piVar23;
  long lVar24;
  undefined1 *puVar25;
  int *piVar26;
  uint uVar27;
  long lVar28;
  ulong *puVar29;
  int32_t *piVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i in [256];
  longlong local_1038 [30];
  int local_f48 [36];
  undefined1 local_eb8 [3720];
  
  piVar20 = av1_fwd_txfm_shift_ls[0x11];
  bVar35 = tx_type < 0x10;
  uVar27 = 0xbeaf >> (tx_type & 0x1f);
  uVar31 = 0x7f1f >> (tx_type & 0x1f);
  lVar24 = (long)stride;
  iVar21 = (int)*av1_fwd_txfm_shift_ls[0x11];
  piVar26 = local_f48;
  lVar28 = lVar24 * 2;
  lVar33 = lVar24 * 4;
  lVar5 = lVar24 * 6;
  uVar32 = 0xfffffffffffffffc;
  uVar34 = 0;
  puVar29 = (ulong *)input;
  do {
    if ((uVar27 & 1) == 0 && bVar35) {
      uVar2 = puVar29[3];
      uVar3 = puVar29[2];
      uVar4 = puVar29[1];
      puVar22 = puVar29;
    }
    else {
      uVar2 = *puVar29;
      uVar3 = puVar29[1];
      uVar4 = puVar29[2];
      puVar22 = (ulong *)(input + uVar34 * lVar24 + 0xc);
    }
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar4;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar3;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar2;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = *puVar22;
    if ((uVar31 & 1) == 0 && bVar35) {
      auVar36 = pshuflw(auVar36,auVar36,0x1b);
      auVar40 = pshuflw(auVar40,auVar40,0x1b);
      auVar44 = pshuflw(auVar44,auVar44,0x1b);
      auVar48 = pshuflw(auVar48,auVar48,0x1b);
    }
    auVar36 = pmovsxwd(auVar36,auVar36);
    auVar40 = pmovsxwd(auVar40,auVar40);
    auVar44 = pmovsxwd(auVar44,auVar44);
    auVar48 = pmovsxwd(auVar48,auVar48);
    piVar26[-0x3c] = auVar36._0_4_ << iVar21;
    piVar26[-0x3b] = auVar36._4_4_;
    piVar26[-0x3a] = auVar36._8_4_;
    piVar26[-0x39] = auVar36._12_4_;
    piVar26[-0x38] = auVar40._0_4_ << iVar21;
    piVar26[-0x37] = auVar40._4_4_;
    piVar26[-0x36] = auVar40._8_4_;
    piVar26[-0x35] = auVar40._12_4_;
    piVar26[-0x34] = auVar44._0_4_ << iVar21;
    piVar26[-0x33] = auVar44._4_4_;
    piVar26[-0x32] = auVar44._8_4_;
    piVar26[-0x31] = auVar44._12_4_;
    piVar26[-0x30] = auVar48._0_4_ << iVar21;
    piVar26[-0x2f] = auVar48._4_4_;
    piVar26[-0x2e] = auVar48._8_4_;
    piVar26[-0x2d] = auVar48._12_4_;
    if ((uVar27 & 1) == 0 && bVar35) {
      puVar22 = (ulong *)((long)puVar29 + lVar28);
      uVar2 = *(ulong *)((long)puVar29 + lVar28 + 0x18);
      uVar3 = *(ulong *)((long)puVar29 + lVar28 + 0x10);
      uVar4 = *(ulong *)((long)puVar29 + lVar28 + 8);
    }
    else {
      uVar2 = *(ulong *)((long)puVar29 + lVar28);
      uVar3 = *(ulong *)((long)puVar29 + lVar28 + 8);
      uVar4 = *(ulong *)((long)puVar29 + lVar28 + 0x10);
      puVar22 = (ulong *)(input + (uVar34 | 1) * lVar24 + 0xc);
    }
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar4;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar3;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar2;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = *puVar22;
    if ((uVar31 & 1) == 0 && bVar35) {
      auVar37 = pshuflw(auVar37,auVar37,0x1b);
      auVar41 = pshuflw(auVar41,auVar41,0x1b);
      auVar45 = pshuflw(auVar45,auVar45,0x1b);
      auVar49 = pshuflw(auVar49,auVar49,0x1b);
    }
    auVar36 = pmovsxwd(auVar37,auVar37);
    auVar40 = pmovsxwd(auVar41,auVar41);
    auVar44 = pmovsxwd(auVar45,auVar45);
    auVar48 = pmovsxwd(auVar49,auVar49);
    piVar26[-0x2c] = auVar36._0_4_ << iVar21;
    piVar26[-0x2b] = auVar36._4_4_;
    piVar26[-0x2a] = auVar36._8_4_;
    piVar26[-0x29] = auVar36._12_4_;
    piVar26[-0x28] = auVar40._0_4_ << iVar21;
    piVar26[-0x27] = auVar40._4_4_;
    piVar26[-0x26] = auVar40._8_4_;
    piVar26[-0x25] = auVar40._12_4_;
    piVar26[-0x24] = auVar44._0_4_ << iVar21;
    piVar26[-0x23] = auVar44._4_4_;
    piVar26[-0x22] = auVar44._8_4_;
    piVar26[-0x21] = auVar44._12_4_;
    piVar26[-0x20] = auVar48._0_4_ << iVar21;
    piVar26[-0x1f] = auVar48._4_4_;
    piVar26[-0x1e] = auVar48._8_4_;
    piVar26[-0x1d] = auVar48._12_4_;
    if ((uVar27 & 1) == 0 && bVar35) {
      puVar22 = (ulong *)((long)puVar29 + lVar33);
      uVar2 = *(ulong *)((long)puVar29 + lVar33 + 0x18);
      uVar3 = *(ulong *)((long)puVar29 + lVar33 + 0x10);
      uVar4 = *(ulong *)((long)puVar29 + lVar33 + 8);
    }
    else {
      uVar2 = *(ulong *)((long)puVar29 + lVar33);
      uVar3 = *(ulong *)((long)puVar29 + lVar33 + 8);
      uVar4 = *(ulong *)((long)puVar29 + lVar33 + 0x10);
      puVar22 = (ulong *)(input + (uVar34 | 2) * lVar24 + 0xc);
    }
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar4;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar3;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar2;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = *puVar22;
    if ((uVar31 & 1) == 0 && bVar35) {
      auVar38 = pshuflw(auVar38,auVar38,0x1b);
      auVar42 = pshuflw(auVar42,auVar42,0x1b);
      auVar46 = pshuflw(auVar46,auVar46,0x1b);
      auVar50 = pshuflw(auVar50,auVar50,0x1b);
    }
    auVar36 = pmovsxwd(auVar38,auVar38);
    auVar40 = pmovsxwd(auVar42,auVar42);
    auVar44 = pmovsxwd(auVar46,auVar46);
    auVar48 = pmovsxwd(auVar50,auVar50);
    piVar26[-0x1c] = auVar36._0_4_ << iVar21;
    piVar26[-0x1b] = auVar36._4_4_;
    piVar26[-0x1a] = auVar36._8_4_;
    piVar26[-0x19] = auVar36._12_4_;
    piVar26[-0x18] = auVar40._0_4_ << iVar21;
    piVar26[-0x17] = auVar40._4_4_;
    piVar26[-0x16] = auVar40._8_4_;
    piVar26[-0x15] = auVar40._12_4_;
    piVar26[-0x14] = auVar44._0_4_ << iVar21;
    piVar26[-0x13] = auVar44._4_4_;
    piVar26[-0x12] = auVar44._8_4_;
    piVar26[-0x11] = auVar44._12_4_;
    piVar26[-0x10] = auVar48._0_4_ << iVar21;
    piVar26[-0xf] = auVar48._4_4_;
    piVar26[-0xe] = auVar48._8_4_;
    piVar26[-0xd] = auVar48._12_4_;
    if ((uVar27 & 1) == 0 && bVar35) {
      puVar22 = (ulong *)((long)puVar29 + lVar5);
      uVar2 = *(ulong *)((long)puVar29 + lVar5 + 0x18);
      uVar3 = *(ulong *)((long)puVar29 + lVar5 + 0x10);
      uVar4 = *(ulong *)((long)puVar29 + lVar5 + 8);
    }
    else {
      uVar2 = *(ulong *)((long)puVar29 + lVar5);
      uVar3 = *(ulong *)((long)puVar29 + lVar5 + 8);
      uVar4 = *(ulong *)((long)puVar29 + lVar5 + 0x10);
      puVar22 = (ulong *)(input + (uVar34 | 3) * lVar24 + 0xc);
    }
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar4;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar2;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *puVar22;
    if ((uVar31 & 1) == 0 && bVar35) {
      auVar39 = pshuflw(auVar39,auVar39,0x1b);
      auVar43 = pshuflw(auVar43,auVar43,0x1b);
      auVar47 = pshuflw(auVar47,auVar47,0x1b);
      auVar51 = pshuflw(auVar51,auVar51,0x1b);
    }
    auVar36 = pmovsxwd(auVar39,auVar39);
    auVar40 = pmovsxwd(auVar43,auVar43);
    auVar44 = pmovsxwd(auVar47,auVar47);
    auVar48 = pmovsxwd(auVar51,auVar51);
    piVar26[-0xc] = auVar36._0_4_ << iVar21;
    piVar26[-0xb] = auVar36._4_4_;
    piVar26[-10] = auVar36._8_4_;
    piVar26[-9] = auVar36._12_4_;
    piVar26[-8] = auVar40._0_4_ << iVar21;
    piVar26[-7] = auVar40._4_4_;
    piVar26[-6] = auVar40._8_4_;
    piVar26[-5] = auVar40._12_4_;
    piVar26[-4] = auVar44._0_4_ << iVar21;
    piVar26[-3] = auVar44._4_4_;
    piVar26[-2] = auVar44._8_4_;
    piVar26[-1] = auVar44._12_4_;
    *piVar26 = auVar48._0_4_ << iVar21;
    piVar26[1] = auVar48._4_4_;
    piVar26[2] = auVar48._8_4_;
    piVar26[3] = auVar48._12_4_;
    uVar34 = uVar34 + 4;
    piVar26 = piVar26 + 0x40;
    uVar32 = uVar32 + 4;
    puVar29 = puVar29 + lVar24;
  } while (uVar32 < 0x3c);
  lVar33 = 0;
  do {
    av1_fdct64_sse4_1((__m128i *)((long)local_1038 + lVar33),(__m128i *)((long)coeff + lVar33),'\r',
                      4,4);
    lVar33 = lVar33 + 0x10;
  } while (lVar33 != 0x40);
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)piVar20[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar20[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar20[1]);
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar20[1]);
  piVar23 = coeff + 0x30;
  puVar25 = local_eb8;
  lVar33 = 0;
  do {
    lVar28 = -0x80;
    piVar30 = piVar23;
    do {
      iVar13 = piVar30[-0x2f];
      iVar14 = piVar30[-0x2e];
      iVar15 = piVar30[-0x2d];
      iVar6 = piVar30[-0x1f];
      iVar7 = piVar30[-0x1e];
      iVar8 = piVar30[-0x1d];
      iVar16 = piVar30[-0x10];
      iVar17 = piVar30[-0xf];
      iVar18 = piVar30[-0xe];
      iVar19 = piVar30[-0xd];
      iVar9 = *piVar30;
      iVar10 = piVar30[1];
      iVar11 = piVar30[2];
      iVar12 = piVar30[3];
      *(ulong *)(puVar25 + lVar28 + -0x100) = CONCAT44(piVar30[-0x20],piVar30[-0x30]);
      *(ulong *)((long)(puVar25 + lVar28 + -0x100) + 8) = CONCAT44(iVar9,iVar16);
      *(int32_t *)(puVar25 + lVar28 + -0x78) = iVar13;
      *(int32_t *)(puVar25 + lVar28 + -0x74) = iVar6;
      *(int32_t *)(puVar25 + lVar28 + -0x70) = iVar17;
      *(int32_t *)(puVar25 + lVar28 + -0x6c) = iVar10;
      piVar1 = (int32_t *)(puVar25 + lVar28);
      *piVar1 = iVar14;
      piVar1[1] = iVar7;
      piVar1[2] = iVar18;
      piVar1[3] = iVar11;
      *(int32_t *)(puVar25 + lVar28 + 0x88) = iVar15;
      *(int32_t *)(puVar25 + lVar28 + 0x8c) = iVar8;
      *(int32_t *)(puVar25 + lVar28 + 0x90) = iVar19;
      *(int32_t *)(puVar25 + lVar28 + 0x94) = iVar12;
      piVar30 = piVar30 + 0x40;
      lVar28 = lVar28 + 0x10;
    } while (lVar28 != 0);
    lVar33 = lVar33 + 1;
    piVar23 = piVar23 + 4;
    puVar25 = puVar25 + 0x200;
  } while (lVar33 != 4);
  fdct16x16_sse4_1((__m128i *)local_1038,(__m128i *)coeff,0xc,8);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X64];
  const int txw_idx = get_txw_idx(TX_16X64);
  const int txh_idx = get_txh_idx(TX_16X64);
  const int txfm_size_col = tx_size_wide[TX_16X64];
  const int txfm_size_row = tx_size_high[TX_16X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const int num_col = txfm_size_col >> 2;
  // col tranform
  for (int i = 0; i < txfm_size_row; i += num_col) {
    load_buffer_4x4(input + (i + 0) * stride, in + (i + 0) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 1) * stride, in + (i + 1) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 2) * stride, in + (i + 2) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + (i + 3) * stride, in + (i + 3) * num_col, num_col,
                    ud_flip, lr_flip, shift[0]);
  }

  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitcol, num_col, num_col);
  }

  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, 32);
  fdct16x16_sse4_1(in, outcoeff128, bitrow, 8);
  (void)bd;
}